

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O1

int get_archive_comment(int argc,char **argv)

{
  undefined8 in_RAX;
  long lVar1;
  int len;
  uint local_4;
  
  local_4 = (uint)((ulong)in_RAX >> 0x20);
  lVar1 = zip_get_archive_comment(za,&local_4,0);
  if (lVar1 == 0) {
    puts("No archive comment");
  }
  else {
    printf("Archive comment: %.*s\n",(ulong)local_4,lVar1);
  }
  return 0;
}

Assistant:

static int
get_archive_comment(int argc, char *argv[]) {
    const char *comment;
    int len;
    /* get archive comment */
    if ((comment = zip_get_archive_comment(za, &len, 0)) == NULL)
	printf("No archive comment\n");
    else
	printf("Archive comment: %.*s\n", len, comment);
    return 0;
}